

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double **ppdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  int *piVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  double *pdVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  double *pdVar46;
  ulong uVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  double __x;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  double local_100;
  double local_e8;
  
  if (0 < partitionCount) {
    uVar49 = 0;
    do {
      iVar14 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar49]];
      iVar15 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar49] + 1];
      lVar37 = (long)iVar15;
      lVar32 = (long)iVar14;
      iVar33 = iVar15 - iVar14;
      memset(this->integrationTmp + this->kStateCount * iVar14,0,
             (long)(this->kStateCount * iVar33) << 3);
      memset(this->firstDerivTmp + this->kStateCount * iVar14,0,
             (long)(this->kStateCount * iVar33) << 3);
      memset(this->secondDerivTmp + this->kStateCount * iVar14,0,
             (long)(iVar33 * this->kStateCount) << 3);
      iVar33 = childBufferIndices[uVar49];
      iVar16 = cumulativeScaleIndices[uVar49];
      ppdVar20 = this->gTransitionMatrices;
      pdVar21 = ppdVar20[firstDerivativeIndices[uVar49]];
      pdVar22 = ppdVar20[probabilityIndices[uVar49]];
      pdVar23 = ppdVar20[secondDerivativeIndices[uVar49]];
      pdVar24 = this->gCategoryWeights[categoryWeightsIndices[uVar49]];
      pdVar25 = this->gStateFrequencies[stateFrequenciesIndices[uVar49]];
      pdVar26 = this->gPartials[parentBufferIndices[uVar49]];
      if ((iVar33 < this->kTipCount) && (piVar27 = this->gTipStates[iVar33], piVar27 != (int *)0x0))
      {
        iVar33 = this->kCategoryCount;
        uVar48 = this->kStateCount;
        if (0 < (long)iVar33) {
          iVar17 = this->kPartialsPaddedStateCount;
          iVar18 = this->kMatrixSize;
          iVar42 = 0;
          iVar40 = iVar17 * iVar14;
          iVar19 = this->kPatternCount;
          lVar38 = 0;
          do {
            if (iVar14 < iVar15) {
              pdVar34 = this->integrationTmp;
              iVar36 = this->kTransPaddedStateCount;
              lVar41 = (long)iVar40;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = pdVar24[lVar38];
              pdVar28 = this->firstDerivTmp;
              pdVar29 = this->secondDerivTmp;
              pdVar46 = pdVar26 + lVar41;
              lVar44 = lVar32;
              iVar35 = uVar48 * iVar14;
              do {
                if (0 < (int)uVar48) {
                  uVar45 = 0;
                  lVar39 = (long)piVar27[lVar44] + (long)iVar42;
                  do {
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pdVar34[(long)iVar35 + uVar45];
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = pdVar22[lVar39] * pdVar46[uVar45];
                    auVar53 = vfmadd213sd_fma(auVar58,auVar52,auVar1);
                    pdVar34[(long)iVar35 + uVar45] = auVar53._0_8_;
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar28[(long)iVar35 + uVar45];
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = pdVar21[lVar39] * pdVar46[uVar45];
                    auVar53 = vfmadd213sd_fma(auVar59,auVar52,auVar2);
                    pdVar28[(long)iVar35 + uVar45] = auVar53._0_8_;
                    pdVar30 = pdVar23 + lVar39;
                    lVar39 = lVar39 + iVar36;
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = pdVar29[(long)iVar35 + uVar45];
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = *pdVar30 * pdVar46[uVar45];
                    auVar53 = vfmadd213sd_fma(auVar60,auVar52,auVar3);
                    pdVar29[(long)iVar35 + uVar45] = auVar53._0_8_;
                    uVar45 = uVar45 + 1;
                  } while (uVar48 != uVar45);
                  iVar35 = iVar35 + (int)uVar45;
                }
                lVar41 = lVar41 + iVar17;
                iVar40 = (int)lVar41;
                pdVar46 = pdVar46 + iVar17;
                lVar44 = lVar44 + 1;
              } while (lVar44 != lVar37);
            }
            iVar40 = iVar40 + ((iVar14 - iVar15) + iVar19) * iVar17;
            lVar38 = lVar38 + 1;
            iVar42 = iVar42 + iVar18;
          } while (lVar38 != iVar33);
        }
      }
      else {
        iVar17 = this->kCategoryCount;
        uVar48 = this->kStateCount;
        if (0 < (long)iVar17) {
          pdVar46 = this->gPartials[iVar33];
          iVar33 = this->kMatrixSize;
          iVar40 = 0;
          lVar38 = 0;
          iVar18 = this->kPartialsPaddedStateCount;
          iVar19 = this->kPatternCount;
          uVar43 = iVar18 * iVar14;
          do {
            uVar45 = (ulong)uVar43;
            if (iVar14 < iVar15) {
              uVar45 = (ulong)(int)uVar43;
              pdVar28 = this->integrationTmp;
              pdVar29 = this->secondDerivTmp;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = pdVar24[lVar38];
              pdVar34 = pdVar46 + uVar45;
              pdVar30 = this->firstDerivTmp;
              uVar50 = (ulong)(uVar48 * iVar14);
              iVar42 = iVar14;
              do {
                if (0 < (int)uVar48) {
                  uVar50 = (ulong)(int)uVar50;
                  uVar47 = 0;
                  iVar36 = iVar40;
                  do {
                    auVar52 = ZEXT816(0) << 0x40;
                    auVar67 = ZEXT816(0) << 0x40;
                    auVar62 = ZEXT816(0) << 0x40;
                    uVar31 = 0;
                    do {
                      auVar72._8_8_ = 0;
                      auVar72._0_8_ = pdVar34[uVar31];
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = pdVar22[(long)iVar36 + uVar31];
                      auVar62 = vfmadd231sd_fma(auVar62,auVar72,auVar4);
                      auVar5._8_8_ = 0;
                      auVar5._0_8_ = pdVar21[(long)iVar36 + uVar31];
                      auVar67 = vfmadd231sd_fma(auVar67,auVar72,auVar5);
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = pdVar23[(long)iVar36 + uVar31];
                      auVar52 = vfmadd231sd_fma(auVar52,auVar72,auVar6);
                      uVar31 = uVar31 + 1;
                    } while (uVar48 != uVar31);
                    iVar36 = iVar36 + uVar48 + 1;
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = pdVar28[uVar50];
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = auVar62._0_8_ * pdVar26[uVar45 + uVar47];
                    auVar62 = vfmadd213sd_fma(auVar70,auVar53,auVar7);
                    pdVar28[uVar50] = auVar62._0_8_;
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = pdVar30[uVar50];
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = auVar67._0_8_ * pdVar26[uVar45 + uVar47];
                    auVar62 = vfmadd213sd_fma(auVar68,auVar53,auVar62);
                    pdVar30[uVar50] = auVar62._0_8_;
                    lVar44 = uVar45 + uVar47;
                    uVar47 = uVar47 + 1;
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = pdVar29[uVar50];
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = auVar52._0_8_ * pdVar26[lVar44];
                    auVar62 = vfmadd213sd_fma(auVar61,auVar53,auVar67);
                    pdVar29[uVar50] = auVar62._0_8_;
                    uVar50 = uVar50 + 1;
                  } while (uVar47 != uVar48);
                }
                uVar45 = uVar45 + (long)iVar18;
                pdVar34 = pdVar34 + iVar18;
                iVar42 = iVar42 + 1;
              } while (iVar42 != iVar15);
            }
            uVar43 = (int)uVar45 + ((iVar14 - iVar15) + iVar19) * iVar18;
            lVar38 = lVar38 + 1;
            iVar40 = iVar40 + iVar33;
          } while (lVar38 != iVar17);
        }
      }
      if (iVar14 < iVar15) {
        iVar33 = uVar48 * iVar14;
        lVar38 = lVar32;
        do {
          iVar17 = this->kStateCount;
          if ((long)iVar17 < 1) {
            __x = 0.0;
            local_e8 = 0.0;
            local_100 = 0.0;
          }
          else {
            auVar62 = ZEXT816(0);
            auVar71 = ZEXT864(0) << 0x40;
            auVar53 = ZEXT816(0);
            lVar44 = 0;
            do {
              auVar69._8_8_ = 0;
              auVar69._0_8_ = pdVar25[lVar44];
              auVar8._8_8_ = 0;
              auVar8._0_8_ = this->integrationTmp[iVar33 + lVar44];
              auVar53 = vfmadd231sd_fma(auVar53,auVar69,auVar8);
              __x = auVar53._0_8_;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = this->firstDerivTmp[iVar33 + lVar44];
              auVar67 = vfmadd231sd_fma(auVar71._0_16_,auVar69,auVar9);
              auVar71 = ZEXT1664(auVar67);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = this->secondDerivTmp[iVar33 + lVar44];
              auVar62 = vfmadd231sd_fma(auVar62,auVar69,auVar10);
              lVar44 = lVar44 + 1;
            } while (iVar17 != lVar44);
            iVar33 = iVar33 + iVar17;
            local_100 = auVar62._0_8_;
            local_e8 = auVar67._0_8_;
          }
          dVar51 = log(__x);
          this->outLogLikelihoodsTmp[lVar38] = dVar51;
          auVar63._0_8_ = local_100 / __x;
          auVar63._8_8_ = 0;
          auVar54._0_8_ = local_e8 / __x;
          auVar54._8_8_ = 0;
          this->outFirstDerivativesTmp[lVar38] = auVar54._0_8_;
          auVar53 = vfnmadd231sd_fma(auVar63,auVar54,auVar54);
          this->outSecondDerivativesTmp[lVar38] = auVar53._0_8_;
          lVar38 = lVar38 + 1;
        } while (lVar38 != lVar37);
        if (iVar16 != -1) {
          if (iVar15 <= iVar14) goto LAB_0012755a;
          pdVar21 = this->gScaleBuffers[iVar16];
          pdVar22 = this->outLogLikelihoodsTmp;
          lVar38 = lVar32;
          do {
            pdVar22[lVar38] = pdVar21[lVar38] + pdVar22[lVar38];
            lVar38 = lVar38 + 1;
          } while (lVar37 != lVar38);
        }
        outSumLogLikelihoodByPartition[uVar49] = 0.0;
        outSumFirstDerivativeByPartition[uVar49] = 0.0;
        outSumSecondDerivativeByPartition[uVar49] = 0.0;
        if (iVar14 < iVar15) {
          pdVar21 = this->gPatternWeights;
          pdVar22 = this->outLogLikelihoodsTmp;
          pdVar23 = this->outFirstDerivativesTmp;
          pdVar24 = this->outSecondDerivativesTmp;
          do {
            auVar55._8_8_ = 0;
            auVar55._0_8_ = pdVar22[lVar32];
            auVar64._8_8_ = 0;
            auVar64._0_8_ = pdVar21[lVar32];
            auVar11._8_8_ = 0;
            auVar11._0_8_ = outSumLogLikelihoodByPartition[uVar49];
            auVar53 = vfmadd213sd_fma(auVar64,auVar55,auVar11);
            outSumLogLikelihoodByPartition[uVar49] = auVar53._0_8_;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = pdVar23[lVar32];
            auVar65._8_8_ = 0;
            auVar65._0_8_ = pdVar21[lVar32];
            auVar12._8_8_ = 0;
            auVar12._0_8_ = outSumFirstDerivativeByPartition[uVar49];
            auVar53 = vfmadd213sd_fma(auVar65,auVar56,auVar12);
            outSumFirstDerivativeByPartition[uVar49] = auVar53._0_8_;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = pdVar24[lVar32];
            auVar66._8_8_ = 0;
            auVar66._0_8_ = pdVar21[lVar32];
            lVar32 = lVar32 + 1;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = outSumSecondDerivativeByPartition[uVar49];
            auVar53 = vfmadd213sd_fma(auVar66,auVar57,auVar13);
            outSumSecondDerivativeByPartition[uVar49] = auVar53._0_8_;
          } while (lVar37 != lVar32);
        }
      }
      else {
LAB_0012755a:
        outSumLogLikelihoodByPartition[uVar49] = 0.0;
        outSumFirstDerivativeByPartition[uVar49] = 0.0;
        outSumSecondDerivativeByPartition[uVar49] = 0.0;
      }
      uVar49 = uVar49 + 1;
    } while (uVar49 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}